

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

void noise_get_heavy(_func_void_void_ptr_int *func)

{
  FILE *pFVar1;
  _Bool _Var2;
  FILE *pFVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  _Bool got_dev_urandom;
  int ret;
  FILE *fp;
  char buf [512];
  _func_void_void_ptr_int *func_local;
  
  _Var2 = read_dev_urandom((char *)&fp,0x20);
  if (_Var2) {
    (*func)(&fp,0x20);
  }
  pFVar3 = popen("ps -axu 2>/dev/null","r");
  pFVar1 = _stderr;
  if (pFVar3 == (FILE *)0x0) {
    if (!_Var2) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar1,"popen: %s\nUnable to access fallback entropy source\n",pcVar6);
      exit(1);
    }
  }
  else {
    while (sVar4 = fread(&fp,1,0x200,pFVar3), 0 < (int)sVar4) {
      (*func)(&fp,(int)sVar4);
    }
    pclose(pFVar3);
  }
  pFVar3 = popen("ls -al /tmp 2>/dev/null","r");
  pFVar1 = _stderr;
  if (pFVar3 == (FILE *)0x0) {
    if (!_Var2) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar1,"popen: %s\nUnable to access fallback entropy source\n",pcVar6);
      exit(1);
    }
  }
  else {
    while (sVar4 = fread(&fp,1,0x200,pFVar3), 0 < (int)sVar4) {
      (*func)(&fp,(int)sVar4);
    }
    pclose(pFVar3);
  }
  read_random_seed(func);
  return;
}

Assistant:

void noise_get_heavy(void (*func) (void *, int))
{
    char buf[512];
    FILE *fp;
    int ret;
    bool got_dev_urandom = false;

    if (read_dev_urandom(buf, 32)) {
        got_dev_urandom = true;
        func(buf, 32);
    }

    fp = popen("ps -axu 2>/dev/null", "r");
    if (fp) {
        while ( (ret = fread(buf, 1, sizeof(buf), fp)) > 0)
            func(buf, ret);
        pclose(fp);
    } else if (!got_dev_urandom) {
        fprintf(stderr, "popen: %s\n"
                "Unable to access fallback entropy source\n", strerror(errno));
        exit(1);
    }

    fp = popen("ls -al /tmp 2>/dev/null", "r");
    if (fp) {
        while ( (ret = fread(buf, 1, sizeof(buf), fp)) > 0)
            func(buf, ret);
        pclose(fp);
    } else if (!got_dev_urandom) {
        fprintf(stderr, "popen: %s\n"
                "Unable to access fallback entropy source\n", strerror(errno));
        exit(1);
    }

    read_random_seed(func);
}